

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

bcf_hrec_t * bcf_hrec_dup(bcf_hrec_t *hrec)

{
  int iVar1;
  bcf_hrec_t *pbVar2;
  char *pcVar3;
  char **ppcVar4;
  int local_20;
  int local_1c;
  int j;
  int i;
  bcf_hrec_t *out;
  bcf_hrec_t *hrec_local;
  
  pbVar2 = (bcf_hrec_t *)calloc(1,0x30);
  pbVar2->type = hrec->type;
  if (hrec->key != (char *)0x0) {
    pcVar3 = strdup(hrec->key);
    pbVar2->key = pcVar3;
  }
  if (hrec->value != (char *)0x0) {
    pcVar3 = strdup(hrec->value);
    pbVar2->value = pcVar3;
  }
  pbVar2->nkeys = hrec->nkeys;
  ppcVar4 = (char **)malloc((long)hrec->nkeys << 3);
  pbVar2->keys = ppcVar4;
  ppcVar4 = (char **)malloc((long)hrec->nkeys << 3);
  pbVar2->vals = ppcVar4;
  local_20 = 0;
  for (local_1c = 0; local_1c < hrec->nkeys; local_1c = local_1c + 1) {
    if ((hrec->keys[local_1c] == (char *)0x0) ||
       (iVar1 = strcmp("IDX",hrec->keys[local_1c]), iVar1 != 0)) {
      if (hrec->keys[local_1c] != (char *)0x0) {
        pcVar3 = strdup(hrec->keys[local_1c]);
        pbVar2->keys[local_20] = pcVar3;
      }
      if (hrec->vals[local_1c] != (char *)0x0) {
        pcVar3 = strdup(hrec->vals[local_1c]);
        pbVar2->vals[local_20] = pcVar3;
      }
      local_20 = local_20 + 1;
    }
  }
  if (local_1c != local_20) {
    pbVar2->nkeys = pbVar2->nkeys - (local_1c - local_20);
  }
  return pbVar2;
}

Assistant:

bcf_hrec_t *bcf_hrec_dup(bcf_hrec_t *hrec)
{
    bcf_hrec_t *out = (bcf_hrec_t*) calloc(1,sizeof(bcf_hrec_t));
    out->type = hrec->type;
    if ( hrec->key ) out->key = strdup(hrec->key);
    if ( hrec->value ) out->value = strdup(hrec->value);
    out->nkeys = hrec->nkeys;
    out->keys = (char**) malloc(sizeof(char*)*hrec->nkeys);
    out->vals = (char**) malloc(sizeof(char*)*hrec->nkeys);
    int i, j = 0;
    for (i=0; i<hrec->nkeys; i++)
    {
        if ( hrec->keys[i] && !strcmp("IDX",hrec->keys[i]) ) continue;
        if ( hrec->keys[i] ) out->keys[j] = strdup(hrec->keys[i]);
        if ( hrec->vals[i] ) out->vals[j] = strdup(hrec->vals[i]);
        j++;
    }
    if ( i!=j ) out->nkeys -= i-j;   // IDX was omitted
    return out;
}